

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix<Rational> __thiscall Matrix<Rational>::power(Matrix<Rational> *this,BigInteger *pow)

{
  uint n;
  bool bVar1;
  matrix_error *this_00;
  BigInteger *in_RDX;
  Rational *extraout_RDX;
  Matrix<Rational> MVar2;
  Matrix<Rational> t;
  Matrix<Rational> a;
  BigInteger p;
  BigInteger local_50;
  
  n = *(uint *)&(pow->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (n == *(uint *)((long)&(pow->digits).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 4)) {
    identity(&t,n);
    Matrix(&a,(Matrix<Rational> *)pow);
    abs((int)&p);
    bVar1 = false;
    while (p.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           p.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      if ((*p.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start & 1) != 0) {
        if (bVar1) {
          bVar1 = true;
          operator*=(&t,&a);
        }
        else {
          bVar1 = true;
          operator=(&t,&a);
        }
      }
      BigInteger::_divide_by_2(&p);
      if (p.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          p.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        operator*=(&a,&a);
      }
    }
    BigInteger::BigInteger(&local_50,0);
    bVar1 = operator<(in_RDX,&local_50);
    if (bVar1) {
      inverted(this);
    }
    else {
      Matrix(this,&t);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p);
    ~Matrix(&a);
    ~Matrix(&t);
    MVar2.arr = extraout_RDX;
    MVar2._0_8_ = this;
    return MVar2;
  }
  this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error(this_00,"Power is only defined for square matrices");
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Matrix<Field> Matrix<Field>::power(const BigInteger &pow) const
{
    if(M != N)
        throw matrix_error("Power is only defined for square matrices");
    Matrix t = identity(width());
    bool t_set = false;
    Matrix a(*this);
    BigInteger p = abs(pow);
    while(p)
    {
        if(p.odd())
        {
            if(t_set)
                t *= a;
            else
                t = a;
            t_set = true;
        }
        p._divide_by_2();
        if(p)
            a *= a;
    }
    return pow < 0 ? t.inverted() : t;
}